

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O1

singlecomplex * singlecomplexCalloc(size_t n)

{
  singlecomplex *__s;
  char msg [256];
  char acStack_128 [264];
  
  __s = (singlecomplex *)superlu_malloc(n * 8);
  if (__s == (singlecomplex *)0x0) {
    sprintf(acStack_128,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in singlecomplexCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cmemory.c");
    superlu_abort_and_exit(acStack_128);
  }
  if (n != 0) {
    memset(__s,0,n * 8);
  }
  return __s;
}

Assistant:

singlecomplex *singlecomplexCalloc(size_t n)
{
    singlecomplex *buf;
    register size_t i;
    singlecomplex zero = {0.0, 0.0};
    buf = (singlecomplex *) SUPERLU_MALLOC(n * (size_t) sizeof(singlecomplex));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in singlecomplexCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}